

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O0

uint __thiscall
Assimp::PretransformVertices::GetMeshVFormat(PretransformVertices *this,aiMesh *pcMesh)

{
  uint iRet;
  aiMesh *pcMesh_local;
  PretransformVertices *this_local;
  
  if (pcMesh->mBones == (aiBone **)0x0) {
    this_local._4_4_ = GetMeshVFormatUnique(pcMesh);
    pcMesh->mBones = (aiBone **)(ulong)this_local._4_4_;
  }
  else {
    this_local._4_4_ = (uint)pcMesh->mBones;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int PretransformVertices::GetMeshVFormat(aiMesh *pcMesh) const {
	// the vertex format is stored in aiMesh::mBones for later retrieval.
	// there isn't a good reason to compute it a few hundred times
	// from scratch. The pointer is unused as animations are lost
	// during PretransformVertices.
	if (pcMesh->mBones)
		return (unsigned int)(uint64_t)pcMesh->mBones;

	const unsigned int iRet = GetMeshVFormatUnique(pcMesh);

	// store the value for later use
	pcMesh->mBones = (aiBone **)(uint64_t)iRet;
	return iRet;
}